

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_valueAssignmentForNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::TestBody(optTyped_valueAssignmentForNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  value_type_conflict2 *lhs;
  double dVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
  local_50;
  string local_48;
  AssertHelper local_28;
  
  dVar1 = (this->
          super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
          ).value_2;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_50.storage_ =
         (this->
         super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
         ).value_1;
    if ((local_50.storage_ != 0.0) || (NAN(local_50.storage_))) {
      local_48._M_dataplus._M_p._0_1_ = '\x01';
      local_48._M_string_length = 0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_60.ptr_._0_1_ = local_50.storage_ != 0.0;
      local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_50.storage_ == 0.0) && (!NAN(local_50.storage_))) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_48,(internal *)&local_60,(AssertionResult *)0x1b9203,"false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x316,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
            &local_48.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
                          local_48.field_2._M_allocated_capacity + 1);
        }
        if (local_68.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((local_50.storage_ == 0.0) && (!NAN(local_50.storage_))) {
        __assert_fail("has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h"
                      ,0xdf,
                      "T &mp::opt<double, mp::opt_null_type_policy<double, (anonymous namespace)::null_floating<double>>>::operator*() & [T = double, Policy = mp::opt_null_type_policy<double, (anonymous namespace)::null_floating<double>>]"
                     );
      }
      lhs = &(this->
             super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
             ).value_1;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_48,"this->value_1","*o",lhs,&local_50.storage_);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_60);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x317,pcVar3);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_60.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_60.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      mp::
      opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
      ::value(&local_50);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_48,"this->value_1","o.value()",lhs,&local_50.storage_);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_60);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x318,pcVar3);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_60.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_60.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_60.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (~-(ulong)(local_50.storage_ != 0.0) &
            (ulong)(this->
                   super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
                   ).value_2 | (ulong)local_50.storage_ & -(ulong)(local_50.storage_ != 0.0));
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_48,"this->value_1","o.value_or(this->value_2)",lhs,
                 (double *)&local_60);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_60);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x319,pcVar3);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_60.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_60.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  }
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h",
                0x7e,
                "mp::opt<double, mp::opt_null_type_policy<double, (anonymous namespace)::null_floating<double>>>::opt(U &&) [T = double, Policy = mp::opt_null_type_policy<double, (anonymous namespace)::null_floating<double>>, U = const double &]"
               );
}

Assistant:

TYPED_TEST(optTyped, valueAssignmentForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o{this->value_2};
  o = this->value_1;
  EXPECT_TRUE(o);
  EXPECT_TRUE(o.has_value());
  EXPECT_EQ(this->value_1, *o);
  EXPECT_EQ(this->value_1, o.value());
  EXPECT_EQ(this->value_1, o.value_or(this->value_2));
}